

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ColumnsFromExprList(Parse *pParse,ExprList *pEList,i16 *pnCol,Column **paCol)

{
  int *piVar1;
  u8 uVar2;
  Table *pTVar3;
  void *p;
  ushort uVar4;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar5;
  Column *data;
  byte *pKey;
  HashElem *pHVar6;
  size_t sVar7;
  ulong uVar8;
  Column *pCVar9;
  byte bVar10;
  ExprList_item *pEVar11;
  Expr *pEVar12;
  ulong uVar13;
  long lVar14;
  char *pcVar15;
  uint uVar16;
  long lVar17;
  u32 cnt;
  Hash ht;
  uint local_7c;
  Column *local_78;
  Column **local_70;
  i16 *local_68;
  ExprList_item *local_60;
  char *local_58;
  long local_50;
  Hash local_48;
  
  local_48.htsize = 0;
  local_48.count = 0;
  local_48.first = (HashElem *)0x0;
  local_48.ht = (_ht *)0x0;
  if (pEList == (ExprList *)0x0) {
    *pnCol = 0;
    *paCol = (Column *)0x0;
    pcVar15 = &pParse->field_0x55;
    pCVar9 = (Column *)0x0;
    uVar16 = 0;
  }
  else {
    iVar5 = pEList->nExpr;
    lVar14 = (long)iVar5;
    data = (Column *)sqlite3DbMallocZero((sqlite3 *)pParse,lVar14 << 5);
    *pnCol = (i16)iVar5;
    *paCol = data;
    if (lVar14 < 1) {
      pcVar15 = &pParse->field_0x55;
      pCVar9 = data;
      lVar14 = 0;
    }
    else {
      local_60 = pEList->a;
      lVar17 = 0;
      local_78 = data;
      local_70 = paCol;
      local_68 = pnCol;
      local_58 = &pParse->field_0x55;
      local_50 = lVar14;
      do {
        pcVar15 = local_58;
        pCVar9 = local_78;
        paCol = local_70;
        pnCol = local_68;
        lVar14 = lVar17;
        if (*local_58 != '\0') break;
        pcVar15 = local_60[lVar17].zName;
        if (pcVar15 == (char *)0x0) {
          pEVar12 = local_60[lVar17].pExpr;
          while (pEVar12 != (Expr *)0x0) {
            if ((pEVar12->flags >> 0xc & 1) == 0) goto LAB_00163b55;
            if ((pEVar12->flags >> 0x12 & 1) == 0) {
              pEVar11 = (ExprList_item *)&pEVar12->pLeft;
            }
            else {
              pEVar11 = ((pEVar12->x).pList)->a;
            }
            pEVar12 = pEVar11->pExpr;
          }
          pEVar12 = (Expr *)0x0;
LAB_00163b55:
          for (; uVar2 = pEVar12->op, uVar2 == 'z'; pEVar12 = pEVar12->pRight) {
          }
          if (uVar2 == '\x1b') {
            pCVar9 = (Column *)&pEVar12->u;
          }
          else if ((uVar2 == 0x98) && (pTVar3 = pEVar12->pTab, pTVar3 != (Table *)0x0)) {
            uVar4 = pEVar12->iColumn;
            if ((short)uVar4 < 0) {
              uVar4 = pTVar3->iPKey;
              pcVar15 = "rowid";
              if ((short)uVar4 < 0) goto LAB_00163bb1;
            }
            pCVar9 = pTVar3->aCol + uVar4;
          }
          else {
            pCVar9 = (Column *)&local_60[lVar17].zSpan;
          }
          pcVar15 = pCVar9->zName;
          if (pcVar15 != (char *)0x0) goto LAB_00163bb1;
          pKey = (byte *)sqlite3MPrintf((sqlite3 *)pParse,"column%d",(ulong)((int)lVar17 + 1));
        }
        else {
LAB_00163bb1:
          pKey = (byte *)sqlite3DbStrDup((sqlite3 *)pParse,pcVar15);
        }
        local_7c = 0;
        while (pKey != (byte *)0x0) {
          pHVar6 = findElementWithHash(&local_48,(char *)pKey,(uint *)0x0);
          if (pHVar6->data == (void *)0x0) {
            data->zName = (char *)pKey;
            pCVar9 = (Column *)sqlite3HashInsert(&local_48,(char *)pKey,data);
            if (((pCVar9 == data) && (*local_58 == '\0')) && (pParse->field_0x56 == '\0')) {
              pParse->field_0x55 = 1;
              if (0 < (int)pParse->oldmask) {
                pParse->aColCache[7].iTable = 1;
              }
              piVar1 = &pParse->aColCache[7].iLevel;
              *piVar1 = *piVar1 + 1;
            }
            goto LAB_00163cca;
          }
          sVar7 = strlen((char *)pKey);
          if ((sVar7 & 0x3fffffff) == 0) {
            uVar13 = 0;
          }
          else {
            uVar8 = (ulong)((uint)sVar7 & 0x3fffffff);
            do {
              if (uVar8 < 2) {
                bVar10 = *pKey;
                uVar8 = 0;
                break;
              }
              uVar8 = uVar8 - 1;
              bVar10 = pKey[uVar8 & 0xffffffff];
            } while (0xfffffffffffffff5 < (ulong)bVar10 - 0x3a);
            uVar13 = (ulong)((uint)sVar7 & 0x3fffffff);
            if (bVar10 == 0x3a) {
              uVar13 = uVar8 & 0xffffffff;
            }
          }
          local_7c = local_7c + 1;
          pKey = (byte *)sqlite3MPrintf((sqlite3 *)pParse,"%.*z:%u",uVar13,pKey);
          if (3 < local_7c) {
            sqlite3_randomness(4,&local_7c);
          }
        }
        data->zName = (char *)0x0;
LAB_00163cca:
        lVar17 = lVar17 + 1;
        data = data + 1;
        pcVar15 = local_58;
        pCVar9 = local_78;
        paCol = local_70;
        pnCol = local_68;
        lVar14 = local_50;
      } while (lVar17 != local_50);
    }
    uVar16 = (uint)lVar14;
  }
  sqlite3HashClear(&local_48);
  if (*pcVar15 == '\0') {
    return extraout_EAX;
  }
  if (uVar16 == 0) {
    iVar5 = extraout_EAX;
    if (pCVar9 == (Column *)0x0) goto LAB_00163d8f;
  }
  else {
    lVar14 = 0;
    do {
      p = *(void **)((long)&pCVar9->zName + lVar14);
      if (p != (void *)0x0) {
        sqlite3DbFreeNN((sqlite3 *)pParse,p);
      }
      lVar14 = lVar14 + 0x20;
    } while ((ulong)uVar16 << 5 != lVar14);
  }
  sqlite3DbFreeNN((sqlite3 *)pParse,pCVar9);
  iVar5 = extraout_EAX_00;
LAB_00163d8f:
  *paCol = (Column *)0x0;
  *pnCol = 0;
  return iVar5;
}

Assistant:

SQLITE_PRIVATE int sqlite3ColumnsFromExprList(
  Parse *pParse,          /* Parsing context */
  ExprList *pEList,       /* Expr list from which to derive column names */
  i16 *pnCol,             /* Write the number of columns here */
  Column **paCol          /* Write the new column list here */
){
  sqlite3 *db = pParse->db;   /* Database connection */
  int i, j;                   /* Loop counters */
  u32 cnt;                    /* Index added to make the name unique */
  Column *aCol, *pCol;        /* For looping over result columns */
  int nCol;                   /* Number of columns in the result set */
  char *zName;                /* Column name */
  int nName;                  /* Size of name in zName[] */
  Hash ht;                    /* Hash table of column names */

  sqlite3HashInit(&ht);
  if( pEList ){
    nCol = pEList->nExpr;
    aCol = sqlite3DbMallocZero(db, sizeof(aCol[0])*nCol);
    testcase( aCol==0 );
  }else{
    nCol = 0;
    aCol = 0;
  }
  assert( nCol==(i16)nCol );
  *pnCol = nCol;
  *paCol = aCol;

  for(i=0, pCol=aCol; i<nCol && !db->mallocFailed; i++, pCol++){
    /* Get an appropriate name for the column
    */
    if( (zName = pEList->a[i].zName)!=0 ){
      /* If the column contains an "AS <name>" phrase, use <name> as the name */
    }else{
      Expr *pColExpr = sqlite3ExprSkipCollate(pEList->a[i].pExpr);
      while( pColExpr->op==TK_DOT ){
        pColExpr = pColExpr->pRight;
        assert( pColExpr!=0 );
      }
      if( pColExpr->op==TK_COLUMN && pColExpr->pTab!=0 ){
        /* For columns use the column name name */
        int iCol = pColExpr->iColumn;
        Table *pTab = pColExpr->pTab;
        if( iCol<0 ) iCol = pTab->iPKey;
        zName = iCol>=0 ? pTab->aCol[iCol].zName : "rowid";
      }else if( pColExpr->op==TK_ID ){
        assert( !ExprHasProperty(pColExpr, EP_IntValue) );
        zName = pColExpr->u.zToken;
      }else{
        /* Use the original text of the column expression as its name */
        zName = pEList->a[i].zSpan;
      }
    }
    if( zName ){
      zName = sqlite3DbStrDup(db, zName);
    }else{
      zName = sqlite3MPrintf(db,"column%d",i+1);
    }

    /* Make sure the column name is unique.  If the name is not unique,
    ** append an integer to the name so that it becomes unique.
    */
    cnt = 0;
    while( zName && sqlite3HashFind(&ht, zName)!=0 ){
      nName = sqlite3Strlen30(zName);
      if( nName>0 ){
        for(j=nName-1; j>0 && sqlite3Isdigit(zName[j]); j--){}
        if( zName[j]==':' ) nName = j;
      }
      zName = sqlite3MPrintf(db, "%.*z:%u", nName, zName, ++cnt);
      if( cnt>3 ) sqlite3_randomness(sizeof(cnt), &cnt);
    }
    pCol->zName = zName;
    sqlite3ColumnPropertiesFromName(0, pCol);
    if( zName && sqlite3HashInsert(&ht, zName, pCol)==pCol ){
      sqlite3OomFault(db);
    }
  }
  sqlite3HashClear(&ht);
  if( db->mallocFailed ){
    for(j=0; j<i; j++){
      sqlite3DbFree(db, aCol[j].zName);
    }
    sqlite3DbFree(db, aCol);
    *paCol = 0;
    *pnCol = 0;
    return SQLITE_NOMEM_BKPT;
  }
  return SQLITE_OK;
}